

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_profiler.c
# Opt level: O0

SUNErrCode SUNProfiler_Print(SUNProfiler p,FILE *fp)

{
  SUNErrCode SVar1;
  SUNHashMapKeyValue kv;
  int64_t iVar2;
  FILE *in_RSI;
  long in_RDI;
  int64_t i;
  double resolution;
  SUNHashMapKeyValue *sorted;
  sunTimerStruct *timer;
  int rank;
  int64_t ier;
  sunTimerStruct *in_stack_ffffffffffffffb0;
  SUNProfiler in_stack_ffffffffffffffb8;
  sunTimerStruct *psVar3;
  SUNHashMapKeyValue **in_stack_ffffffffffffffc0;
  SUNHashMap map;
  void *pvoid;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  char *key;
  SUNErrCode local_4;
  
  key = (char *)0x0;
  iVar4 = 0;
  pvoid = (void *)0x0;
  map = (SUNHashMap)0x0;
  if (in_RDI == 0) {
    local_4 = -9999;
  }
  else {
    sunStartTiming((sunTimerStruct *)0x1193d4);
    kv = (SUNHashMapKeyValue)
         SUNHashMap_GetValue((SUNHashMap)in_RSI,key,
                             (void **)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
    if (kv == (SUNHashMapKeyValue)0xffffffffffffff9d) {
      local_4 = -0x26fd;
    }
    else if (kv == (SUNHashMapKeyValue)0xffffffffffffffff) {
      local_4 = -0x26fb;
    }
    else {
      *(undefined8 *)(in_RDI + 0x20) = *(undefined8 *)((long)pvoid + 0x20);
      if (iVar4 == 0) {
        SVar1 = SUNHashMap_Sort(map,in_stack_ffffffffffffffc0,
                                (_func_int_void_ptr_void_ptr *)in_stack_ffffffffffffffb8);
        if (SVar1 != 0) {
          return -0x26fa;
        }
        SUNProfiler_GetTimerResolution
                  (in_stack_ffffffffffffffb8,(double *)in_stack_ffffffffffffffb0);
        fprintf(in_RSI,
                "\n================================================================================================================\n"
               );
        fprintf(in_RSI,"SUNDIALS GIT VERSION: %s\n","v7.3.0");
        fprintf(in_RSI,"SUNDIALS PROFILER: %s\n",*(undefined8 *)(in_RDI + 8));
        fprintf(in_RSI,"TIMER RESOLUTION: %gs\n",in_stack_ffffffffffffffc0);
        fprintf(in_RSI,"%-40s\t %% time (inclusive) \t max/rank \t average/rank \t count \n",
                "RESULTS:");
        fprintf(in_RSI,
                "================================================================================================================\n"
               );
        in_stack_ffffffffffffffb0 = (sunTimerStruct *)0x0;
        while (psVar3 = in_stack_ffffffffffffffb0, iVar2 = SUNHashMap_Capacity((SUNHashMap)0x119527)
              , (long)in_stack_ffffffffffffffb0 < iVar2) {
          if ((&map->destroyKeyValue)[(long)psVar3] !=
              (_func_SUNErrCode_SUNHashMapKeyValue_ptr *)0x0) {
            sunPrintTimer(kv,(FILE *)CONCAT44(iVar4,in_stack_ffffffffffffffd8),pvoid);
          }
          in_stack_ffffffffffffffb0 = (sunTimerStruct *)((long)&psVar3->tic + 1);
        }
        free(map);
      }
      sunStopTiming(in_stack_ffffffffffffffb0);
      if (iVar4 == 0) {
        fprintf(in_RSI,"%-40s\t %6.2f%% \t         %.6fs \t -- \t\t -- \n",
                *(double *)(*(long *)(in_RDI + 0x18) + 0x20) / *(double *)(in_RDI + 0x20),
                *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x20),"Est. profiler overhead");
        fprintf(in_RSI,"\n");
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

SUNErrCode SUNProfiler_Print(SUNProfiler p, FILE* fp)
{
  int64_t ier                = 0;
  int rank                   = 0;
  sunTimerStruct* timer      = NULL;
  SUNHashMapKeyValue* sorted = NULL;

  if (!p) { return SUN_ERR_ARG_CORRUPT; }

  sunStartTiming(p->overhead);

  /* Get the total SUNDIALS time up to this point */
  SUNDIALS_MARK_END(p, SUNDIALS_ROOT_TIMER);
  SUNDIALS_MARK_BEGIN(p, SUNDIALS_ROOT_TIMER);

  ier = SUNHashMap_GetValue(p->map, SUNDIALS_ROOT_TIMER, (void**)&timer);
  if (ier == SUNHASHMAP_ERROR) { return SUN_ERR_PROFILER_MAPGET; }
  if (ier == SUNHASHMAP_KEYNOTFOUND) { return SUN_ERR_PROFILER_MAPKEYNOTFOUND; }
  p->sundials_time = timer->elapsed;

#if SUNDIALS_MPI_ENABLED
  if (p->comm != SUN_COMM_NULL)
  {
    MPI_Comm_rank(p->comm, &rank);
    /* Find the max and average time across all ranks */
    sunCollectTimers(p);
  }
#endif

  if (rank == 0)
  {
    double resolution;
    /* Sort the timers in descending order */
    if (SUNHashMap_Sort(p->map, &sorted, sunCompareTimes))
    {
      return SUN_ERR_PROFILER_MAPSORT;
    }
    SUNProfiler_GetTimerResolution(p, &resolution);
    fprintf(fp, "\n============================================================"
                "====================================================\n");
    fprintf(fp, "SUNDIALS GIT VERSION: %s\n", SUNDIALS_GIT_VERSION);
    fprintf(fp, "SUNDIALS PROFILER: %s\n", p->title);
    fprintf(fp, "TIMER RESOLUTION: %gs\n", resolution);
    fprintf(fp, "%-40s\t %% time (inclusive) \t max/rank \t average/rank \t count \n",
            "RESULTS:");
    fprintf(fp, "=============================================================="
                "==================================================\n");

#if SUNDIALS_MPI_ENABLED
    if (p->comm == SUN_COMM_NULL)
    {
      printf(
        "WARNING: no MPI communicator provided, times shown are for rank 0\n");
    }
#endif

    /* Print all the other timers out */
    for (int64_t i = 0; i < SUNHashMap_Capacity(p->map); i++)
    {
      if (sorted[i]) { sunPrintTimer(sorted[i], fp, (void*)p); }
    }
    free(sorted);
  }

  sunStopTiming(p->overhead);

  if (rank == 0)
  {
    /* Print out the total time and the profiler overhead */
    fprintf(fp, "%-40s\t %6.2f%% \t         %.6fs \t -- \t\t -- \n",
            "Est. profiler overhead", p->overhead->elapsed / p->sundials_time,
            p->overhead->elapsed);

    /* End of output */
    fprintf(fp, "\n");
  }

  return SUN_SUCCESS;
}